

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restincurl.h
# Opt level: O2

void __thiscall
restincurl::Request::AddFileAsMimeData
          (Request *this,string *path,string *name,string *remoteName,string *mimeType)

{
  undefined8 uVar1;
  char *pcVar2;
  
  InitMime(this);
  if (this->mime_ == (curl_mime *)0x0) {
    __assert_fail("mime_",
                  "/workspace/llm4binary/github/license_c_cmakelists/jgaa[P]RESTinCurl/include/restincurl/restincurl.h"
                  ,0x21b,
                  "void restincurl::Request::AddFileAsMimeData(const std::string &, const std::string &, const std::string &, const std::string &)"
                 );
  }
  uVar1 = curl_mime_addpart();
  curl_mime_filedata(uVar1,(path->_M_dataplus)._M_p);
  if (name->_M_string_length == 0) {
    pcVar2 = "file";
  }
  else {
    pcVar2 = (name->_M_dataplus)._M_p;
  }
  curl_mime_name(uVar1,pcVar2);
  if (remoteName->_M_string_length != 0) {
    curl_mime_filename(uVar1,(remoteName->_M_dataplus)._M_p);
  }
  if (mimeType->_M_string_length != 0) {
    curl_mime_type(uVar1,(mimeType->_M_dataplus)._M_p);
    return;
  }
  return;
}

Assistant:

void AddFileAsMimeData(const std::string& path,
                               const std::string& name,
                               const std::string& remoteName,
                               const std::string& mimeType) {

            InitMime();
            assert(mime_);
            auto * part = curl_mime_addpart(mime_);
            curl_mime_filedata(part, path.c_str());
            curl_mime_name(part, name.empty() ? "file" :name.c_str());

            if (!remoteName.empty()) {
                curl_mime_filename(part, remoteName.c_str());
            }

            if (!mimeType.empty()) {
                curl_mime_type(part, mimeType.c_str());
            }
        }